

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Char * Diligent::GetPipelineStateStatusString
                 (PIPELINE_STATE_STATUS PipelineStatus,bool GetEnumString)

{
  char *pcVar1;
  char *pcVar2;
  string msg;
  string local_28;
  
  switch(PipelineStatus) {
  case PIPELINE_STATE_STATUS_UNINITIALIZED:
    pcVar2 = "PIPELINE_STATE_STATUS_UNINITIALIZED";
    pcVar1 = "Uninitialized";
    break;
  case PIPELINE_STATE_STATUS_COMPILING:
    pcVar2 = "PIPELINE_STATE_STATUS_COMPILING";
    pcVar1 = "Compiling";
    break;
  case PIPELINE_STATE_STATUS_READY:
    pcVar2 = "PIPELINE_STATE_STATUS_READY";
    pcVar1 = "Ready";
    break;
  case PIPELINE_STATE_STATUS_FAILED:
    pcVar2 = "PIPELINE_STATE_STATUS_FAILED";
    pcVar1 = "Failed";
    break;
  default:
    FormatString<char[33]>(&local_28,(char (*) [33])"Unexpected pipeline state status");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetPipelineStateStatusString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x9fe);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    return "Unknown";
  }
  if (GetEnumString) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const Char* GetPipelineStateStatusString(PIPELINE_STATE_STATUS PipelineStatus, bool GetEnumString)
{
    switch (PipelineStatus)
    {
        // clang-format off
        case PIPELINE_STATE_STATUS_UNINITIALIZED: return GetEnumString ? "PIPELINE_STATE_STATUS_UNINITIALIZED" : "Uninitialized";
        case PIPELINE_STATE_STATUS_COMPILING:     return GetEnumString ? "PIPELINE_STATE_STATUS_COMPILING"     : "Compiling";
        case PIPELINE_STATE_STATUS_READY: 	      return GetEnumString ? "PIPELINE_STATE_STATUS_READY"         : "Ready";
        case PIPELINE_STATE_STATUS_FAILED: 	      return GetEnumString ? "PIPELINE_STATE_STATUS_FAILED"        : "Failed";
        // clang-format on
        default:
            UNEXPECTED("Unexpected pipeline state status");
            return "Unknown";
    }
}